

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

dat_t * rdr_readdat(rdr_t *rdr,FILE *file,_Bool lbl)

{
  uint uVar1;
  int iVar2;
  dat_t *__ptr;
  seq_t **ppsVar3;
  seq_t *psVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  
  __ptr = (dat_t *)xmalloc(0x18);
  __ptr->mlen = 0;
  __ptr->nseq = 0;
  __ptr->lbl = lbl;
  ppsVar3 = (seq_t **)xmalloc(8000);
  __ptr->seq = ppsVar3;
  uVar7 = 1000;
  do {
    uVar6 = (uint)uVar7;
    iVar2 = feof((FILE *)file);
    if (iVar2 != 0) break;
    psVar4 = rdr_readseq(rdr,file,lbl);
    if (psVar4 != (seq_t *)0x0) {
      if (__ptr->nseq == uVar6) {
        uVar7 = (ulong)((double)(uVar7 & 0xffffffff) * 1.4);
        ppsVar3 = (seq_t **)xrealloc(__ptr->seq,(uVar7 & 0xffffffff) << 3);
        __ptr->seq = ppsVar3;
      }
      uVar6 = __ptr->nseq;
      uVar5 = uVar6 + 1;
      __ptr->nseq = uVar5;
      __ptr->seq[uVar6] = psVar4;
      uVar6 = psVar4->len;
      if (psVar4->len < __ptr->mlen) {
        uVar6 = __ptr->mlen;
      }
      __ptr->mlen = uVar6;
      if ((uVar5 * 0x26e978d5 >> 3 | uVar5 * -0x60000000) < 0x418938) {
        info("%7u sequences loaded\n");
      }
    }
    uVar6 = (uint)uVar7;
  } while (psVar4 != (seq_t *)0x0);
  uVar1 = __ptr->nseq;
  if ((ulong)uVar1 == 0) {
    free(__ptr->seq);
    free(__ptr);
    __ptr = (dat_t *)0x0;
  }
  else if (uVar1 < uVar6) {
    ppsVar3 = (seq_t **)xrealloc(__ptr->seq,(ulong)uVar1 << 3);
    __ptr->seq = ppsVar3;
  }
  return __ptr;
}

Assistant:

dat_t *rdr_readdat(rdr_t *rdr, FILE *file, bool lbl) {
	// Prepare dataset
	uint32_t size = 1000;
	dat_t *dat = xmalloc(sizeof(dat_t));
	dat->nseq = 0;
	dat->mlen = 0;
	dat->lbl = lbl;
	dat->seq = xmalloc(sizeof(seq_t *) * size);
	// Load sequences
	while (!feof(file)) {
		// Read the next sequence
		seq_t *seq = rdr_readseq(rdr, file, lbl);
		if (seq == NULL)
			break;
		// Grow the buffer if needed
		if (dat->nseq == size) {
			size *= 1.4;
			dat->seq = xrealloc(dat->seq, sizeof(seq_t *) * size);
		}
		// And store the sequence
		dat->seq[dat->nseq++] = seq;
		dat->mlen = max(dat->mlen, seq->len);
		if (dat->nseq % 1000 == 0)
			info("%7"PRIu32" sequences loaded\n", dat->nseq);
	}
	// If no sequence readed, cleanup and repport
	if (dat->nseq == 0) {
		free(dat->seq);
		free(dat);
		return NULL;
	}
	// Adjust the dataset size and return
	if (size > dat->nseq)
		dat->seq = xrealloc(dat->seq, sizeof(seq_t *) * dat->nseq);
	return dat;
}